

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall
S2Builder::AddExtraSite
          (S2Builder *this,S2Point *new_site,InputEdgeId max_edge_id,
          MutableS2ShapeIndex *input_edge_index,vector<int,_std::allocator<int>_> *snap_queue)

{
  bool bVar1;
  size_type sVar2;
  compact_array_base<int,_std::allocator<int>_> *this_00;
  reference pvVar3;
  reference x;
  value_type *site_ids;
  reference pRStack_3b8;
  InputEdgeId e;
  Result *result;
  iterator __end1;
  iterator __begin1;
  vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  *__range1;
  undefined1 local_370 [8];
  PointTarget target;
  S2ClosestEdgeQuery query;
  undefined1 local_50 [8];
  Options options;
  SiteId new_site_id;
  vector<int,_std::allocator<int>_> *snap_queue_local;
  MutableS2ShapeIndex *input_edge_index_local;
  InputEdgeId max_edge_id_local;
  S2Point *new_site_local;
  S2Builder *this_local;
  
  sVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size(&this->sites_);
  options.super_Options._20_4_ = SUB84(sVar2,0);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back(&this->sites_,new_site)
  ;
  S2ClosestEdgeQuery::Options::Options((Options *)local_50);
  S2ClosestEdgeQuery::Options::set_conservative_max_distance
            ((Options *)local_50,(S1ChordAngle)(this->edge_site_query_radius_ca_).length2_);
  S2ClosestEdgeQueryBase<S2MinDistance>::Options::set_include_interiors((Options *)local_50,false);
  S2ClosestEdgeQuery::S2ClosestEdgeQuery
            ((S2ClosestEdgeQuery *)(target.super_S2MinDistancePointTarget.point_.c_ + 2),
             &input_edge_index->super_S2ShapeIndex,(Options *)local_50);
  S2ClosestEdgeQuery::PointTarget::PointTarget((PointTarget *)local_370,new_site);
  S2ClosestEdgeQuery::FindClosestEdges
            ((vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
              *)&__begin1,
             (S2ClosestEdgeQuery *)(target.super_S2MinDistancePointTarget.point_.c_ + 2),
             (Target *)local_370);
  __end1 = std::
           vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
           ::begin((vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
                    *)&__begin1);
  result = (Result *)
           std::
           vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
           ::end((vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
                  *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<S2ClosestEdgeQueryBase<S2MinDistance>::Result_*,_std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>_>
                                *)&result);
    if (!bVar1) break;
    pRStack_3b8 = __gnu_cxx::
                  __normal_iterator<S2ClosestEdgeQueryBase<S2MinDistance>::Result_*,_std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>_>
                  ::operator*(&__end1);
    site_ids._4_4_ = S2ClosestEdgeQueryBase<S2MinDistance>::Result::edge_id(pRStack_3b8);
    this_00 = &std::
               vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
               ::operator[](&this->edge_sites_,(long)site_ids._4_4_)->
               super_compact_array_base<int,_std::allocator<int>_>;
    gtl::compact_array_base<int,_std::allocator<int>_>::push_back
              (this_00,(value_type_conflict1 *)&options.super_Options.include_interiors_);
    pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (&this->input_edges_,(long)site_ids._4_4_);
    x = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                  (&this->input_vertices_,(long)pvVar3->first);
    SortSitesByDistance(this,x,(compact_array<int,_std::allocator<int>_> *)this_00);
    if (site_ids._4_4_ <= max_edge_id) {
      std::vector<int,_std::allocator<int>_>::push_back
                (snap_queue,(value_type_conflict1 *)((long)&site_ids + 4));
    }
    __gnu_cxx::
    __normal_iterator<S2ClosestEdgeQueryBase<S2MinDistance>::Result_*,_std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  ::~vector((vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
             *)&__begin1);
  S2ClosestEdgeQuery::PointTarget::~PointTarget((PointTarget *)local_370);
  S2ClosestEdgeQuery::~S2ClosestEdgeQuery
            ((S2ClosestEdgeQuery *)(target.super_S2MinDistancePointTarget.point_.c_ + 2));
  return;
}

Assistant:

void S2Builder::AddExtraSite(const S2Point& new_site,
                             InputEdgeId max_edge_id,
                             const MutableS2ShapeIndex& input_edge_index,
                             vector<InputEdgeId>* snap_queue) {
  SiteId new_site_id = sites_.size();
  sites_.push_back(new_site);
  // Find all edges whose distance is <= edge_site_query_radius_ca_.
  S2ClosestEdgeQuery::Options options;
  options.set_conservative_max_distance(edge_site_query_radius_ca_);
  options.set_include_interiors(false);
  S2ClosestEdgeQuery query(&input_edge_index, options);
  S2ClosestEdgeQuery::PointTarget target(new_site);
  for (const auto& result : query.FindClosestEdges(&target)) {
    InputEdgeId e = result.edge_id();
    auto* site_ids = &edge_sites_[e];
    site_ids->push_back(new_site_id);
    SortSitesByDistance(input_vertices_[input_edges_[e].first], site_ids);
    if (e <= max_edge_id) snap_queue->push_back(e);
  }
}